

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.cpp
# Opt level: O2

vector<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
* __thiscall
miniros::master::RegistrationManager::getTopicSubscribers
          (vector<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
           *__return_storage_ptr__,RegistrationManager *this,string *topic)

{
  pointer pbVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sub_api;
  shared_ptr<miniros::master::NodeRef> node;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  undefined1 local_40 [16];
  
  ::std::mutex::lock(&this->m_guard);
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Registrations::getApis(&local_58,&this->subscribers,topic);
  for (pbVar1 = local_58.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 != local_58.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
    getNodeByAPIUnsafe((RegistrationManager *)local_40,(string *)this);
    if (local_40._0_8_ != 0) {
      ::std::
      vector<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_40);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_guard);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<NodeRef>> RegistrationManager::getTopicSubscribers(const std::string& topic) const
{
  std::scoped_lock<std::mutex> lock(m_guard);

  std::vector<std::shared_ptr<NodeRef>> result;
  std::vector<std::string> sub_api = subscribers.getApis(topic);
  for (const auto& api: sub_api) {
    auto node = getNodeByAPIUnsafe(api);
    if (node) {
      result.push_back(node);
    }
  }
  return result;
}